

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void interactive(ChaiScript_Basic *chai)

{
  bool bVar1;
  Type_Info *this;
  ostream *poVar2;
  eval_error *ee;
  exception *e;
  string local_138;
  shared_ptr<chaiscript::detail::Exception_Handler_Base> local_118;
  allocator<char> local_101;
  string local_100;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Type_Info local_a0;
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50 [24];
  Boxed_Value val;
  string input;
  ChaiScript_Basic *chai_local;
  
  using_history();
  do {
    get_next_command_abi_cxx11_();
    std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::shared_ptr
              ((shared_ptr<chaiscript::detail::Exception_Handler_Base> *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"__EVAL__",&local_71);
    chaiscript::ChaiScript_Basic::eval
              ((ChaiScript_Basic *)(local_50 + 0x10),(string *)chai,
               (Exception_Handler *)
               &val.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(string *)local_50);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::~shared_ptr
              ((shared_ptr<chaiscript::detail::Exception_Handler_Base> *)local_50);
    this = chaiscript::Boxed_Value::get_type_info((Boxed_Value *)(local_50 + 0x10));
    chaiscript::user_type<void>();
    bVar1 = chaiscript::Type_Info::bare_equal(this,&local_a0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"to_string",&local_101);
      std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::shared_ptr(&local_118);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"__EVAL__",(allocator<char> *)((long)&e + 7));
      chaiscript::ChaiScript_Basic::
      eval<std::function<std::__cxx11::string(chaiscript::Boxed_Value_const&)>>
                (&local_e0,chai,&local_100,&local_118,&local_138);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
      ::operator()(&local_c0,&local_e0,(Boxed_Value *)(local_50 + 0x10));
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_c0);
      std::operator<<(poVar2,'\n');
      std::__cxx11::string::~string((string *)&local_c0);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
      ::~function(&local_e0);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
      std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::~shared_ptr(&local_118);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
    }
    chaiscript::Boxed_Value::~Boxed_Value((Boxed_Value *)(local_50 + 0x10));
    std::__cxx11::string::~string
              ((string *)
               &val.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while( true );
}

Assistant:

void interactive(chaiscript::ChaiScript_Basic &chai) {
  using_history();

  for (;;) {
    std::string input = get_next_command();
    try {
      // evaluate input
      chaiscript::Boxed_Value val = chai.eval(input);

      // Then, we try to print the result of the evaluation to the user
      if (!val.get_type_info().bare_equal(chaiscript::user_type<void>())) {
        try {
          std::cout << chai.eval<std::function<std::string(const chaiscript::Boxed_Value &bv)>>("to_string")(val) << '\n';
        } catch (...) {
        } // If we can't, do nothing
      }
    } catch (const chaiscript::exception::eval_error &ee) {
      std::cout << ee.what();
      if (!ee.call_stack.empty()) {
        std::cout << "during evaluation at (" << ee.call_stack[0].start().line << ", " << ee.call_stack[0].start().column << ")";
      }
      std::cout << '\n';
    } catch (const std::exception &e) {
      std::cout << e.what();
      std::cout << '\n';
    }
  }
}